

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::create_mac_rhs(NavierStokesBase *this,MultiFab *rhs,int nGrow,Real time,Real dt)

{
  FillPatchIterator fpi;
  FillPatchIterator local_228;
  
  if (have_divu == 0) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&rhs->super_FabArray<amrex::FArrayBox>,0.0,0,
               (rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
               &(rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  }
  else {
    amrex::AmrLevel::FillPatch(&this->super_AmrLevel,rhs,nGrow,time,Divu_Type,0,1,0);
  }
  if (have_dsdt != 0) {
    amrex::FillPatchIterator::FillPatchIterator
              (&local_228,&this->super_AmrLevel,rhs,nGrow,time,Dsdt_Type,0,1);
    amrex::MultiFab::Saxpy(rhs,dt * 0.5,&local_228.m_fabs,0,0,1,nGrow);
    amrex::FillPatchIterator::~FillPatchIterator(&local_228);
  }
  return;
}

Assistant:

void
NavierStokesBase::create_mac_rhs (MultiFab& rhs, int nGrow, Real time, Real dt)
{
    BL_PROFILE("NavierStokesBase::create_mac_rhs()");

    AMREX_ASSERT(rhs.nGrow()>=nGrow);
    AMREX_ASSERT(rhs.boxArray()==grids);

    const int sCompDivU = 0;
    const int nCompDivU = 1;
    const int sCompDsdt = 0;
    const int nCompDsdt = 1;

    if (have_divu)
    {
       FillPatch(*this,rhs,nGrow,time,Divu_Type,sCompDivU,nCompDivU,sCompDivU);
    }
    else
    {
       rhs.setVal(0.);
    }

    if (have_dsdt)
    {
       FillPatchIterator fpi(*this,rhs,nGrow,time,Dsdt_Type,sCompDsdt,nCompDsdt);
       const MultiFab& mf = fpi.get_mf();
       MultiFab::Saxpy(rhs, 0.5*dt, mf, 0, sCompDsdt, nCompDsdt, nGrow);
    }
}